

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  long in_RDI;
  float width_or_weight;
  int n;
  bool save_ref_scale;
  ImGuiTableColumnSettings *column_settings;
  ImGuiTableColumn *column;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  float local_3c;
  undefined4 in_stack_ffffffffffffffc8;
  float fVar4;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  ImGuiID in_stack_ffffffffffffffd4;
  ImGuiTableColumnSettings *local_28;
  uint *local_20;
  ImGuiTableSettings *local_18;
  
  *(undefined1 *)(in_RDI + 0x210) = 0;
  pIVar2 = GImGui;
  if ((*(uint *)(in_RDI + 4) & 0x10) == 0) {
    local_18 = TableGetBoundSettings
                         ((ImGuiTable *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (local_18 == (ImGuiTableSettings *)0x0) {
      local_18 = TableSettingsCreate(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      iVar3 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar2->SettingsTables,local_18);
      *(int *)(in_RDI + 0x6c) = iVar3;
    }
    local_18->ColumnsCount = (ImGuiTableColumnIdx)*(undefined4 *)(in_RDI + 0x74);
    local_20 = *(uint **)(in_RDI + 0x18);
    local_28 = ImGuiTableSettings::GetColumnSettings(local_18);
    bVar1 = false;
    local_18->SaveFlags = 0;
    for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x74); iVar3 = iVar3 + 1) {
      if ((*local_20 & 8) == 0) {
        fVar4 = (float)local_20[4];
      }
      else {
        fVar4 = (float)local_20[6];
      }
      local_28->WidthOrWeight = fVar4;
      local_28->Index = (ImGuiTableColumnIdx)iVar3;
      local_28->DisplayOrder = *(ImGuiTableColumnIdx *)((long)local_20 + 0x52);
      local_28->SortOrder = *(ImGuiTableColumnIdx *)((long)local_20 + 0x56);
      local_28->field_0xb = local_28->field_0xb & 0xfc | *(byte *)((long)local_20 + 0x65) & 3;
      local_28->field_0xb = local_28->field_0xb & 0xfb | (*(byte *)((long)local_20 + 0x5b) & 1) << 2
      ;
      local_28->field_0xb = local_28->field_0xb & 0xf7 | ((*local_20 & 8) != 0) << 3;
      if ((*local_20 & 8) == 0) {
        bVar1 = true;
      }
      if ((fVar4 != (float)local_20[7]) || (NAN(fVar4) || NAN((float)local_20[7]))) {
        local_18->SaveFlags = local_18->SaveFlags | 1;
      }
      if (*(char *)((long)local_20 + 0x52) != iVar3) {
        local_18->SaveFlags = local_18->SaveFlags | 2;
      }
      if (*(char *)((long)local_20 + 0x56) != -1) {
        local_18->SaveFlags = local_18->SaveFlags | 8;
      }
      if ((bool)(*(byte *)((long)local_20 + 0x5b) & 1) != ((*local_20 & 2) == 0)) {
        local_18->SaveFlags = local_18->SaveFlags | 4;
      }
      local_20 = local_20 + 0x1a;
      local_28 = local_28 + 1;
    }
    local_18->SaveFlags = *(uint *)(in_RDI + 4) & local_18->SaveFlags;
    if (bVar1) {
      local_3c = *(float *)(in_RDI + 0xec);
    }
    else {
      local_3c = 0.0;
    }
    local_18->RefScale = local_3c;
    MarkIniSettingsDirty();
  }
  return;
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsUserEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsUserEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}